

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

char ** gen_options(uint program)

{
  bool bVar1;
  char *pcVar2;
  void *pvVar3;
  ushort **ppuVar4;
  int in_EDI;
  int delim;
  uint j;
  char **opts;
  char buf [4096];
  uint num_opts;
  uint i;
  size_t in_stack_ffffffffffffefc8;
  void *in_stack_ffffffffffffefd0;
  uint local_1024;
  char **local_1020;
  char local_1018 [4100];
  uint local_14;
  uint local_10;
  int local_c;
  char **local_8;
  
  local_14 = 1;
  if (in_EDI == 0) {
    local_8 = (char **)0x0;
  }
  else {
    local_c = in_EDI;
    local_1020 = (char **)mmalloc((size_t)in_stack_ffffffffffffefd0);
    pcVar2 = (char *)mmalloc((size_t)in_stack_ffffffffffffefd0);
    *local_1020 = pcVar2;
    local_1020[1] = (char *)0x0;
    if (local_c == 1) {
      strcpy(*local_1020,"gbas");
    }
    else {
      strcpy(*local_1020,"gbld");
    }
    for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
      if (((options[local_10].set != 0) && ((local_c != 1 || (options[local_10].as_opt != 0)))) &&
         ((local_c != 2 || (options[local_10].ld_opt != 0)))) {
        local_14 = local_14 + 1;
        local_1020 = (char **)mrealloc(in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
        local_1020[local_14] = (char *)0x0;
        if (options[local_10].type == flag) {
          strlen(options[local_10].name);
          pcVar2 = (char *)mmalloc((size_t)in_stack_ffffffffffffefd0);
          local_1020[local_14 - 1] = pcVar2;
          strcpy(local_1020[local_14 - 1],options[local_10].name);
        }
        else if (options[local_10].type == number) {
          sprintf(local_1018,"%s%d",options[local_10].name,(ulong)(uint)options[local_10].value.num)
          ;
          strlen(local_1018);
          pcVar2 = (char *)mmalloc((size_t)in_stack_ffffffffffffefd0);
          local_1020[local_14 - 1] = pcVar2;
          strcpy(local_1020[local_14 - 1],local_1018);
        }
        else if (options[local_10].type == string) {
          bVar1 = false;
          local_14 = local_14 + 1;
          local_1020 = (char **)mrealloc(in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
          local_1020[local_14] = (char *)0x0;
          local_1024 = 0;
          while( true ) {
            in_stack_ffffffffffffefd0 = (void *)(ulong)local_1024;
            pvVar3 = (void *)strlen(options[local_10].value.str);
            if (pvVar3 <= in_stack_ffffffffffffefd0) break;
            ppuVar4 = __ctype_b_loc();
            if (((*ppuVar4)[(int)options[local_10].value.str[local_1024]] & 0x2000) != 0) {
              bVar1 = true;
              break;
            }
            local_1024 = local_1024 + 1;
          }
          if (bVar1) {
            sprintf(local_1018,"\"%s\"",options[local_10].value.str);
          }
          else {
            strcpy(local_1018,options[local_10].value.str);
          }
          strlen(options[local_10].name);
          pcVar2 = (char *)mmalloc((size_t)in_stack_ffffffffffffefd0);
          local_1020[local_14 - 2] = pcVar2;
          strlen(local_1018);
          pcVar2 = (char *)mmalloc((size_t)in_stack_ffffffffffffefd0);
          local_1020[local_14 - 1] = pcVar2;
          strcpy(local_1020[local_14 - 2],options[local_10].name);
          strcpy(local_1020[local_14 - 1],local_1018);
        }
      }
    }
    local_8 = local_1020;
  }
  return local_8;
}

Assistant:

char** gen_options(unsigned program)
{
    unsigned i, num_opts = 1;
    char buf[PATH_MAX];
    
    if (program == GBCC)
        return NULL;
    char** opts = (char**)mmalloc((num_opts+1) * sizeof(char*));
    opts[0] = (char*)mmalloc(5);
    opts[1] = NULL;
    
    if (program == GBAS)
        strcpy(opts[0], "gbas");
    else
        strcpy(opts[0], "gbld");
    
    for (i = 0; i < NUM_OPTIONS; ++i)
    {
        if (!options[i].set)
            continue;
        if (program == GBAS && !options[i].as_opt)
            continue;
        if (program == GBLD && !options[i].ld_opt)
            continue;
        
        opts = (char**)mrealloc(opts, (++num_opts+1) * sizeof(char*));
        opts[num_opts] = NULL;
        
        if (options[i].type == flag)    /* -opt */
        {
            opts[num_opts-1] = (char*)mmalloc(strlen(options[i].name) + 1);
            strcpy(opts[num_opts-1], options[i].name);
        }
        else if (options[i].type == number) /* -opt=<number> */
        {
            sprintf(buf, "%s%d", options[i].name, options[i].value.num);
            opts[num_opts-1] = (char*)mmalloc(strlen(buf) + 1);
            strcpy(opts[num_opts-1], buf);
        }
        else if (options[i].type == string) /* -opt <string> */
        {
            unsigned j;
            int delim = 0;
            
            opts = (char**)mrealloc(opts, (++num_opts+1) * sizeof(char*));
            opts[num_opts] = NULL;
            
            for (j = 0; j < strlen(options[i].value.str); ++j)
            {
                if (isspace(options[i].value.str[j]))
                {
                    delim = 1;
                    break;
                }
            }
            
            if (delim)
                sprintf(buf, "\"%s\"", options[i].value.str);
            else
                strcpy(buf, options[i].value.str);
            
            opts[num_opts-2] = (char*)mmalloc(strlen(options[i].name) + 1);
            opts[num_opts-1] = (char*)mmalloc(strlen(buf) + 1);
            
            strcpy(opts[num_opts-2], options[i].name);
            strcpy(opts[num_opts-1], buf);
        }
    }

    return opts;
}